

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

bool google::protobuf::compiler::ApplyMapping
               (string *filename,string *old_prefix,string *new_prefix,string *result)

{
  pointer pcVar1;
  bool bVar2;
  ulong uVar3;
  allocator<char> local_49;
  string after_prefix;
  
  if (old_prefix->_M_string_length == 0) {
    bVar2 = ContainsParentReference(filename);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&after_prefix,"/",&local_49);
      bVar2 = HasPrefixString(filename,&after_prefix);
      std::__cxx11::string::~string((string *)&after_prefix);
      if (!bVar2) {
        std::__cxx11::string::_M_assign((string *)result);
        if (result->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)result);
        }
        std::__cxx11::string::append((string *)result);
        return true;
      }
    }
  }
  else {
    bVar2 = HasPrefixString(filename,old_prefix);
    if (bVar2) {
      uVar3 = old_prefix->_M_string_length;
      if (filename->_M_string_length == uVar3) {
        std::__cxx11::string::_M_assign((string *)result);
        return true;
      }
      pcVar1 = (filename->_M_dataplus)._M_p;
      if (pcVar1[uVar3] == '/') {
        uVar3 = (ulong)((int)uVar3 + 1);
      }
      else if (pcVar1[uVar3 - 1] != '/') {
        return false;
      }
      if ((int)uVar3 != -1) {
        std::__cxx11::string::substr((ulong)&after_prefix,(ulong)filename);
        bVar2 = ContainsParentReference(&after_prefix);
        if (!bVar2) {
          std::__cxx11::string::_M_assign((string *)result);
          if (result->_M_string_length != 0) {
            std::__cxx11::string::push_back((char)result);
          }
          std::__cxx11::string::append((string *)result);
        }
        std::__cxx11::string::~string((string *)&after_prefix);
        return !bVar2;
      }
    }
  }
  return false;
}

Assistant:

static bool ApplyMapping(const string& filename,
                         const string& old_prefix,
                         const string& new_prefix,
                         string* result) {
  if (old_prefix.empty()) {
    // old_prefix matches any relative path.
    if (ContainsParentReference(filename)) {
      // We do not allow the file name to use "..".
      return false;
    }
    if (HasPrefixString(filename, "/") ||
        IsWindowsAbsolutePath(filename)) {
      // This is an absolute path, so it isn't matched by the empty string.
      return false;
    }
    result->assign(new_prefix);
    if (!result->empty()) result->push_back('/');
    result->append(filename);
    return true;
  } else if (HasPrefixString(filename, old_prefix)) {
    // old_prefix is a prefix of the filename.  Is it the whole filename?
    if (filename.size() == old_prefix.size()) {
      // Yep, it's an exact match.
      *result = new_prefix;
      return true;
    } else {
      // Not an exact match.  Is the next character a '/'?  Otherwise,
      // this isn't actually a match at all.  E.g. the prefix "foo/bar"
      // does not match the filename "foo/barbaz".
      int after_prefix_start = -1;
      if (filename[old_prefix.size()] == '/') {
        after_prefix_start = old_prefix.size() + 1;
      } else if (filename[old_prefix.size() - 1] == '/') {
        // old_prefix is never empty, and canonicalized paths never have
        // consecutive '/' characters.
        after_prefix_start = old_prefix.size();
      }
      if (after_prefix_start != -1) {
        // Yep.  So the prefixes are directories and the filename is a file
        // inside them.
        string after_prefix = filename.substr(after_prefix_start);
        if (ContainsParentReference(after_prefix)) {
          // We do not allow the file name to use "..".
          return false;
        }
        result->assign(new_prefix);
        if (!result->empty()) result->push_back('/');
        result->append(after_prefix);
        return true;
      }
    }
  }

  return false;
}